

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
phmap::priv::btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>::
copy_or_move_values_in_order<phmap::priv::btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>const>
          (btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>> *this,
          btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_> *x
          )

{
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
  *pbVar1;
  int iVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  iterator iter;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
  local_30;
  
  if (*(long *)(this + 0x10) != 0) {
    __assert_fail("empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x9a5,
                  "void phmap::priv::btree<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::copy_or_move_values_in_order(Btree *) [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>, Btree = const phmap::priv::btree<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>]"
                 );
  }
  cVar3 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::
          begin(x);
  pbVar1 = cVar3.node;
  iVar2 = cVar3.position;
  local_30.node = pbVar1;
  local_30.position = iVar2;
  cVar4 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::
          end(x);
  if (pbVar1 != cVar4.node || iVar2 != cVar4.position) {
    if (((undefined1  [16])cVar3 & (undefined1  [16])0x7) != (undefined1  [16])0x0) {
LAB_001e4319:
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                    ,0xf84,
                    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                   );
    }
    insert_multi<int_const&>
              (this,(key_type *)(pbVar1 + (long)iVar2 * 4 + 0xc),
               (int *)(pbVar1 + (long)iVar2 * 4 + 0xc));
    btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
    ::increment(&local_30);
    cVar3 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
            ::end(x);
    if ((local_30.node != cVar3.node) || (local_30.position != cVar3.position)) {
      do {
        iter = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
               ::end((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                      *)this);
        if (((ulong)local_30.node & 7) != 0) goto LAB_001e4319;
        internal_emplace<int_const&>
                  (this,iter,(int *)(local_30.node + (long)local_30.position * 4 + 0xc));
        btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
        ::increment(&local_30);
        cVar3 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                ::end(x);
      } while ((local_30.node != cVar3.node) || (local_30.position != cVar3.position));
    }
  }
  return;
}

Assistant:

bool empty() const { return size_ == 0; }